

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtAudio.cpp
# Opt level: O2

void __thiscall RtApiPulse::closeStream(RtApiPulse *this)

{
  StreamMutex *__mutex;
  long *plVar1;
  char *pcVar2;
  
  plVar1 = (long *)(this->super_RtApi).stream_.apiHandle;
  (this->super_RtApi).stream_.callbackInfo.isRunning = false;
  if (plVar1 != (long *)0x0) {
    __mutex = &(this->super_RtApi).stream_.mutex;
    pthread_mutex_lock((pthread_mutex_t *)__mutex);
    if ((this->super_RtApi).stream_.state == STREAM_STOPPED) {
      *(undefined1 *)(plVar1 + 9) = 1;
      pthread_cond_signal((pthread_cond_t *)(plVar1 + 3));
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    pthread_join(plVar1[2],(void **)0x0);
    if (*plVar1 != 0) {
      pa_simple_flush(*plVar1,0);
      pa_simple_free(*plVar1);
    }
    if (plVar1[1] != 0) {
      pa_simple_free();
    }
    pthread_cond_destroy((pthread_cond_t *)(plVar1 + 3));
    operator_delete(plVar1);
    (this->super_RtApi).stream_.apiHandle = (void *)0x0;
  }
  pcVar2 = (this->super_RtApi).stream_.userBuffer[0];
  if (pcVar2 != (char *)0x0) {
    free(pcVar2);
    (this->super_RtApi).stream_.userBuffer[0] = (char *)0x0;
  }
  pcVar2 = (this->super_RtApi).stream_.userBuffer[1];
  if (pcVar2 != (char *)0x0) {
    free(pcVar2);
    (this->super_RtApi).stream_.userBuffer[1] = (char *)0x0;
  }
  RtApi::clearStreamInfo(&this->super_RtApi);
  return;
}

Assistant:

void RtApiPulse::closeStream( void )
{
  PulseAudioHandle *pah = static_cast<PulseAudioHandle *>( stream_.apiHandle );

  stream_.callbackInfo.isRunning = false;
  if ( pah ) {
    MUTEX_LOCK( &stream_.mutex );
    if ( stream_.state == STREAM_STOPPED ) {
      pah->runnable = true;
      pthread_cond_signal( &pah->runnable_cv );
    }
    MUTEX_UNLOCK( &stream_.mutex );

    pthread_join( pah->thread, 0 );
    if ( pah->s_play ) {
      pa_simple_flush( pah->s_play, NULL );
      pa_simple_free( pah->s_play );
    }
    if ( pah->s_rec )
      pa_simple_free( pah->s_rec );

    pthread_cond_destroy( &pah->runnable_cv );
    delete pah;
    stream_.apiHandle = 0;
  }

  if ( stream_.userBuffer[0] ) {
    free( stream_.userBuffer[0] );
    stream_.userBuffer[0] = 0;
  }
  if ( stream_.userBuffer[1] ) {
    free( stream_.userBuffer[1] );
    stream_.userBuffer[1] = 0;
  }

  clearStreamInfo();
}